

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O2

bool __thiscall
cmsys::SystemInformationImplementation::ParseSysCtl(SystemInformationImplementation *this)

{
  return false;
}

Assistant:

bool SystemInformationImplementation::ParseSysCtl()
{
#if defined(__APPLE__)
  char tempBuff[128];
  int32_t tempInt32 = 0;
  int64_t tempInt64 = 0;
  int err = 0;
  size_t len;

  this->TotalPhysicalMemory = 0;
  err = kw_sysctlbyname_int64("hw.memsize", &tempInt64);
  if (err == 0) {
    this->TotalPhysicalMemory = static_cast<size_t>(tempInt64 / 1024 / 1024);
  }

  this->AvailablePhysicalMemory = 0;
  vm_statistics_data_t vmstat;
  mach_msg_type_number_t count = HOST_VM_INFO_COUNT;
  if (host_statistics(mach_host_self(), HOST_VM_INFO,
                      reinterpret_cast<host_info_t>(&vmstat),
                      &count) == KERN_SUCCESS) {
    err = kw_sysctlbyname_int64("hw.pagesize", &tempInt64);
    if (err == 0) {
      int64_t available_memory =
        (vmstat.free_count + vmstat.inactive_count) * tempInt64;
      this->AvailablePhysicalMemory =
        static_cast<size_t>(available_memory / 1024 / 1024);
    }
  }

  // Virtual memory.
  this->AvailableVirtualMemory = 0;
  this->TotalVirtualMemory = 0;
#  ifdef VM_SWAPUSAGE
  int mib[2] = { CTL_VM, VM_SWAPUSAGE };
  unsigned int miblen =
    static_cast<unsigned int>(sizeof(mib) / sizeof(mib[0]));
  struct xsw_usage swap;
  len = sizeof(swap);
  err = sysctl(mib, miblen, &swap, &len, nullptr, 0);
  if (err == 0) {
    this->AvailableVirtualMemory =
      static_cast<size_t>(swap.xsu_avail / 1024 / 1024);
    this->TotalVirtualMemory =
      static_cast<size_t>(swap.xsu_total / 1024 / 1024);
  }
#  endif

  // CPU Info
  this->NumberOfPhysicalCPU = 1;
  err = kw_sysctlbyname_int32("hw.physicalcpu", &tempInt32);
  if (err == 0) {
    this->NumberOfPhysicalCPU = tempInt32;
  }

  this->NumberOfLogicalCPU = 1;
  err = kw_sysctlbyname_int32("hw.logicalcpu", &tempInt32);
  if (err == 0) {
    this->NumberOfLogicalCPU = tempInt32;
  }

  this->Features.ExtendedFeatures.LogicalProcessorsPerPhysical = 1;
  err = kw_sysctlbyname_int32("machdep.cpu.cores_per_package", &tempInt32);
  if (err == 0) {
    this->Features.ExtendedFeatures.LogicalProcessorsPerPhysical = tempInt32;
  }

  this->CPUSpeedInMHz = 0;
  err = kw_sysctlbyname_int64("hw.cpufrequency", &tempInt64);
  if (err == 0) {
    this->CPUSpeedInMHz = static_cast<float>(tempInt64) / 1000000.0f;
  }

  // Chip family
  // Seems only the Intel chips will have this name so if this fails it is
  // a PowerPC or ARM, or something unknown
  this->ChipID.Vendor = "";
  this->ChipID.Family = 0;
  this->ChipID.Model = 0;
  this->ChipID.Revision = 0;
  err = kw_sysctlbyname_int32("machdep.cpu.family", &tempInt32);
  if (err != 0) // Go back to names we know but are less descriptive
  {
    ::memset(tempBuff, 0, sizeof(tempBuff));
    len = sizeof(tempBuff) - 1; // leave a byte for null termination
    err = sysctlbyname("hw.machine", &tempBuff, &len, nullptr, 0);
    if (err == 0) {
      std::string machineBuf(tempBuff);
      if (machineBuf.find_first_of("Power") != std::string::npos) {
        this->ChipID.Vendor = "IBM";

        err = kw_sysctlbyname_int32("hw.cputype", &tempInt32);
        if (err == 0) {
          this->ChipID.Family = tempInt32;
        }

        err = kw_sysctlbyname_int32("hw.cpusubtype", &tempInt32);
        if (err == 0) {
          this->ChipID.Model = tempInt32;
        }

        this->FindManufacturer();
      } else if (machineBuf.find_first_of("arm64") != std::string::npos) {
        this->ChipID.Vendor = "Apple";

        this->FindManufacturer();
      }
    }
  } else {
    // Should be an Intel Chip.
    err = kw_sysctlbyname_int32("machdep.cpu.family", &tempInt32);
    if (err == 0) {
      this->ChipID.Family = tempInt32;
    }

    // Chip Vendor
    ::memset(tempBuff, 0, sizeof(tempBuff));
    len = sizeof(tempBuff) - 1; // leave a byte for null termination
    err = sysctlbyname("machdep.cpu.vendor", tempBuff, &len, nullptr, 0);
    if (err == 0) {
      this->ChipID.Vendor = tempBuff;
    }
    this->FindManufacturer();

    // Chip Model
    err = kw_sysctlbyname_int32("machdep.cpu.model", &tempInt32);
    if (err == 0) {
      this->ChipID.Model = tempInt32;
    }

    // Chip Stepping
    err = kw_sysctlbyname_int32("machdep.cpu.stepping", &tempInt32);
    if (err == 0) {
      this->ChipID.Revision = tempInt32;
    }

    // feature string
    char* buf = nullptr;
    size_t allocSize = 128;

    err = 0;
    len = 0;

    // sysctlbyname() will return with err==0 && len==0 if the buffer is too
    // small
    while (err == 0 && len == 0) {
      delete[] buf;
      allocSize *= 2;
      buf = new char[allocSize];
      if (!buf) {
        break;
      }
      buf[0] = ' ';
      len = allocSize - 2; // keep space for leading and trailing space
      err = sysctlbyname("machdep.cpu.features", buf + 1, &len, nullptr, 0);
    }
    if (err == 0 && buf && len) {
      // now we can match every flags as space + flag + space
      buf[len + 1] = ' ';
      std::string cpuflags(buf, len + 2);

      if (cpuflags.find(" FPU ") != std::string::npos) {
        this->Features.HasFPU = true;
      }
      if (cpuflags.find(" TSC ") != std::string::npos) {
        this->Features.HasTSC = true;
      }
      if (cpuflags.find(" MMX ") != std::string::npos) {
        this->Features.HasMMX = true;
      }
      if (cpuflags.find(" SSE ") != std::string::npos) {
        this->Features.HasSSE = true;
      }
      if (cpuflags.find(" SSE2 ") != std::string::npos) {
        this->Features.HasSSE2 = true;
      }
      if (cpuflags.find(" APIC ") != std::string::npos) {
        this->Features.HasAPIC = true;
      }
      if (cpuflags.find(" CMOV ") != std::string::npos) {
        this->Features.HasCMOV = true;
      }
      if (cpuflags.find(" MTRR ") != std::string::npos) {
        this->Features.HasMTRR = true;
      }
      if (cpuflags.find(" ACPI ") != std::string::npos) {
        this->Features.HasACPI = true;
      }
    }
    delete[] buf;
  }

  // brand string
  this->ChipID.ProcessorName = "";
  this->ChipID.ModelName = "";
  ::memset(tempBuff, 0, sizeof(tempBuff));
  len = sizeof(tempBuff) - 1; // leave a byte for null termination
  err = sysctlbyname("machdep.cpu.brand_string", tempBuff, &len, nullptr, 0);
  if (err == 0) {
    this->ChipID.ProcessorName = tempBuff;
    this->ChipID.ModelName = tempBuff;
  }

  // L1 Cache size
  this->Features.L1CacheSize = 0;
  err = kw_sysctlbyname_int64("hw.l1icachesize", &tempInt64);
  if (err == 0) {
    this->Features.L1CacheSize = static_cast<int>(tempInt64);
  }

  // L2 Cache size
  this->Features.L2CacheSize = 0;
  err = kw_sysctlbyname_int64("hw.l2cachesize", &tempInt64);
  if (err == 0) {
    this->Features.L2CacheSize = static_cast<int>(tempInt64);
  }

  return true;
#else
  return false;
#endif
}